

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module-utils.h
# Opt level: O0

void __thiscall
wasm::ModuleUtils::CallGraphPropertyAnalysis<Info>::propagateBack
          (CallGraphPropertyAnalysis<Info> *this,function<bool_(const_Info_&)> *hasProperty,
          function<bool_(const_Info_&)> *canHaveProperty,function<void_(Info_&)> *addProperty,
          function<void_(const_Info_&,_wasm::Function_*)> *logVisit,NonDirectCalls nonDirectCalls)

{
  bool bVar1;
  vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
  *this_00;
  pointer item;
  mapped_type *pmVar2;
  set<wasm::Function_*,_std::less<wasm::Function_*>,_std::allocator<wasm::Function_*>_> *this_01;
  reference ppFVar3;
  byte local_16b;
  byte local_16a;
  Function *local_130;
  Function *caller;
  iterator __end0;
  iterator __begin0;
  set<wasm::Function_*,_std::less<wasm::Function_*>,_std::allocator<wasm::Function_*>_> *__range4;
  Function *func_1;
  pointer local_100 [3];
  pointer local_e8;
  reference local_e0;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *func;
  iterator __end3;
  iterator __begin3;
  vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
  *__range3;
  UniqueDeferredQueue<wasm::Function_*> work;
  NonDirectCalls nonDirectCalls_local;
  function<void_(const_Info_&,_wasm::Function_*)> *logVisit_local;
  function<void_(Info_&)> *addProperty_local;
  function<bool_(const_Info_&)> *canHaveProperty_local;
  function<bool_(const_Info_&)> *hasProperty_local;
  CallGraphPropertyAnalysis<Info> *this_local;
  
  work.count._M_h._M_single_bucket._4_4_ = nonDirectCalls;
  UniqueDeferredQueue<wasm::Function_*>::UniqueDeferredQueue
            ((UniqueDeferredQueue<wasm::Function_*> *)&__range3);
  this_00 = &this->wasm->functions;
  __end3 = std::
           vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
           ::begin(this_00);
  func = (unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *)
         std::
         vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
         ::end(this_00);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end3,(__normal_iterator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_*,_std::vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>_>
                                     *)&func), bVar1) {
    local_e0 = __gnu_cxx::
               __normal_iterator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_*,_std::vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>_>
               ::operator*(&__end3);
    local_e8 = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::get(local_e0);
    pmVar2 = std::
             map<wasm::Function_*,_Info,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_Info>_>_>
             ::operator[](&this->map,&local_e8);
    bVar1 = std::function<bool_(const_Info_&)>::operator()(hasProperty,pmVar2);
    local_16a = 1;
    if (!bVar1) {
      local_16b = 0;
      if (work.count._M_h._M_single_bucket._4_4_ == NonDirectCallsHaveProperty) {
        local_100[0] = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::get
                                 (local_e0);
        pmVar2 = std::
                 map<wasm::Function_*,_Info,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_Info>_>_>
                 ::operator[](&this->map,local_100);
        local_16b = (pmVar2->super_FunctionInfo).hasNonDirectCall;
      }
      local_16a = local_16b;
    }
    if ((local_16a & 1) != 0) {
      func_1 = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::get(local_e0);
      pmVar2 = std::
               map<wasm::Function_*,_Info,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_Info>_>_>
               ::operator[](&this->map,&func_1);
      std::function<void_(Info_&)>::operator()(addProperty,pmVar2);
      item = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::get(local_e0);
      UniqueDeferredQueue<wasm::Function_*>::push
                ((UniqueDeferredQueue<wasm::Function_*> *)&__range3,item);
    }
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_*,_std::vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>_>
    ::operator++(&__end3);
  }
  while (bVar1 = UniqueDeferredQueue<wasm::Function_*>::empty
                           ((UniqueDeferredQueue<wasm::Function_*> *)&__range3),
        ((bVar1 ^ 0xffU) & 1) != 0) {
    __range4 = (set<wasm::Function_*,_std::less<wasm::Function_*>,_std::allocator<wasm::Function_*>_>
                *)UniqueDeferredQueue<wasm::Function_*>::pop
                            ((UniqueDeferredQueue<wasm::Function_*> *)&__range3);
    pmVar2 = std::
             map<wasm::Function_*,_Info,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_Info>_>_>
             ::operator[](&this->map,(key_type *)&__range4);
    this_01 = &(pmVar2->super_FunctionInfo).calledBy;
    __end0 = std::
             set<wasm::Function_*,_std::less<wasm::Function_*>,_std::allocator<wasm::Function_*>_>::
             begin(this_01);
    caller = (Function *)
             std::
             set<wasm::Function_*,_std::less<wasm::Function_*>,_std::allocator<wasm::Function_*>_>::
             end(this_01);
    while (bVar1 = std::operator!=(&__end0,(_Self *)&caller), bVar1) {
      ppFVar3 = std::_Rb_tree_const_iterator<wasm::Function_*>::operator*(&__end0);
      local_130 = *ppFVar3;
      pmVar2 = std::
               map<wasm::Function_*,_Info,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_Info>_>_>
               ::operator[](&this->map,&local_130);
      bVar1 = std::function<bool_(const_Info_&)>::operator()(canHaveProperty,pmVar2);
      if (bVar1) {
        pmVar2 = std::
                 map<wasm::Function_*,_Info,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_Info>_>_>
                 ::operator[](&this->map,&local_130);
        std::function<void_(const_Info_&,_wasm::Function_*)>::operator()
                  (logVisit,pmVar2,(Function *)__range4);
        pmVar2 = std::
                 map<wasm::Function_*,_Info,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_Info>_>_>
                 ::operator[](&this->map,&local_130);
        bVar1 = std::function<bool_(const_Info_&)>::operator()(hasProperty,pmVar2);
        if (!bVar1) {
          pmVar2 = std::
                   map<wasm::Function_*,_Info,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_Info>_>_>
                   ::operator[](&this->map,&local_130);
          std::function<void_(Info_&)>::operator()(addProperty,pmVar2);
          UniqueDeferredQueue<wasm::Function_*>::push
                    ((UniqueDeferredQueue<wasm::Function_*> *)&__range3,local_130);
        }
      }
      std::_Rb_tree_const_iterator<wasm::Function_*>::operator++(&__end0);
    }
  }
  UniqueDeferredQueue<wasm::Function_*>::~UniqueDeferredQueue
            ((UniqueDeferredQueue<wasm::Function_*> *)&__range3);
  return;
}

Assistant:

void propagateBack(std::function<bool(const T&)> hasProperty,
                     std::function<bool(const T&)> canHaveProperty,
                     std::function<void(T&)> addProperty,
                     std::function<void(const T&, Function*)> logVisit,
                     NonDirectCalls nonDirectCalls) {
    // The work queue contains items we just learned can change the state.
    UniqueDeferredQueue<Function*> work;
    for (auto& func : wasm.functions) {
      if (hasProperty(map[func.get()]) ||
          (nonDirectCalls == NonDirectCallsHaveProperty &&
           map[func.get()].hasNonDirectCall)) {
        addProperty(map[func.get()]);
        work.push(func.get());
      }
    }
    while (!work.empty()) {
      auto* func = work.pop();
      for (auto* caller : map[func].calledBy) {
        // Skip functions forbidden from getting this property.
        if (!canHaveProperty(map[caller])) {
          continue;
        }
        // Log now, even if the function already has the property.
        logVisit(map[caller], func);
        // If we don't already have the property, then add it now, and propagate
        // further.
        if (!hasProperty(map[caller])) {
          addProperty(map[caller]);
          work.push(caller);
        }
      }
    }
  }